

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O1

bool Imf_3_2::anon_unknown_0::readMultiPart
               (MultiPartInputFile *in,bool reduceMemory,bool reduceTime)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  pointer pfVar5;
  pointer puVar6;
  char cVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  Header *pHVar18;
  uint *puVar19;
  int *piVar20;
  Compression *pCVar21;
  string *psVar22;
  long lVar23;
  _Rb_tree_node_base *p_Var24;
  _Rb_tree_node_base *p_Var25;
  undefined8 *puVar26;
  long lVar27;
  void *pvVar28;
  long *plVar29;
  void *pvVar30;
  char *pcVar31;
  void *pvVar32;
  int iVar33;
  char *pcVar34;
  ulong uVar35;
  int x;
  int iVar36;
  bool bVar37;
  long lVar38;
  ulong uVar39;
  long lVar40;
  ulong uVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  int iVar45;
  ulong uVar46;
  size_type sVar47;
  size_t sVar48;
  long lVar49;
  pointer __s;
  bool bVar50;
  pointer phVar51;
  long lVar52;
  bool bVar53;
  bool bVar54;
  bool bVar55;
  long local_1b0;
  InputPart pt;
  long local_150;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> halfChannels;
  vector<float,_std::allocator<float>_> floatChannels;
  FrameBuffer i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> uintChannels;
  DeepFrameBuffer frameBuffer;
  
  iVar9 = Imf_3_2::MultiPartInputFile::parts();
  bVar50 = false;
  if (0 < iVar9) {
    bVar50 = false;
    iVar9 = 0;
    do {
      iVar17 = (int)in;
      pHVar18 = (Header *)Imf_3_2::MultiPartInputFile::header(iVar17);
      cVar7 = Imf_3_2::hasEnvmap(pHVar18);
      if (cVar7 == '\0') {
LAB_001123e8:
        cVar7 = Imf_3_2::hasDeepImageState(pHVar18);
        if (cVar7 != '\0') {
          puVar19 = (uint *)Imf_3_2::deepImageState(pHVar18);
          bVar55 = true;
          if (3 < *puVar19) goto LAB_0011240e;
        }
        bVar55 = bVar50;
      }
      else {
        puVar19 = (uint *)Imf_3_2::envmap(pHVar18);
        bVar55 = true;
        if (*puVar19 < 2) goto LAB_001123e8;
      }
LAB_0011240e:
      Imf_3_2::MultiPartInputFile::header(iVar17);
      piVar20 = (int *)Imf_3_2::Header::dataWindow();
      iVar12 = *piVar20;
      iVar45 = piVar20[2];
      pHVar18 = (Header *)Imf_3_2::MultiPartInputFile::header(iVar17);
      iVar10 = Imf_3_2::calculateBytesPerPixel(pHVar18);
      Imf_3_2::MultiPartInputFile::header(iVar17);
      pCVar21 = (Compression *)Imf_3_2::Header::compression();
      iVar11 = Imf_3_2::numLinesInBuffer(*pCVar21);
      uVar46 = (((long)iVar45 - (long)iVar12) + 1) * (long)iVar10 * (long)iVar11;
      bVar53 = 8000000 < uVar46;
      Imf_3_2::MultiPartInputFile::header(iVar17);
      psVar22 = (string *)Imf_3_2::Header::type_abi_cxx11_();
      cVar7 = Imf_3_2::isTiled(psVar22);
      bVar54 = true;
      if (cVar7 != '\0') {
        Imf_3_2::MultiPartInputFile::header(iVar17);
        puVar19 = (uint *)Imf_3_2::Header::tileDescription();
        uVar41 = (ulong)*puVar19;
        uVar39 = puVar19[1] * uVar41 * (long)iVar10;
        bVar54 = uVar39 < 0xf4241;
        bVar53 = 8000000 < ((((long)iVar45 - (long)iVar12) + uVar41) / uVar41) * uVar39 ||
                 8000000 < uVar46;
      }
      bVar50 = bVar55;
      if ((!reduceMemory) || (bVar53 == false)) {
        Imf_3_2::InputPart::InputPart(&pt,in,iVar9);
        Imf_3_2::InputPart::header();
        piVar20 = (int *)Imf_3_2::Header::dataWindow();
        iVar12 = piVar20[2];
        iVar45 = *piVar20;
        pHVar18 = (Header *)Imf_3_2::InputPart::header();
        lVar23 = Imf_3_2::calculateBytesPerPixel(pHVar18);
        Imf_3_2::InputPart::header();
        pCVar21 = (Compression *)Imf_3_2::Header::compression();
        iVar10 = Imf_3_2::numLinesInBuffer(*pCVar21);
        sVar47 = ((long)iVar12 - (long)iVar45) + 1;
        if (reduceMemory) {
          bVar37 = false;
          bVar8 = false;
          if (lVar23 * sVar47 * (long)iVar10 < 0x7a1201) goto LAB_001125a6;
        }
        else {
LAB_001125a6:
          i._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               i._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
          i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &i._map._M_t._M_impl.super__Rb_tree_header._M_header;
          i._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::vector
                    (&halfChannels,sVar47,(allocator_type *)&frameBuffer);
          std::vector<float,_std::allocator<float>_>::vector
                    (&floatChannels,sVar47,(allocator_type *)&frameBuffer);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&uintChannels,sVar47,(allocator_type *)&frameBuffer);
          puVar6 = uintChannels.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pfVar5 = floatChannels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          phVar51 = halfChannels.
                    super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
                    super__Vector_impl_data._M_start;
          Imf_3_2::InputPart::header();
          Imf_3_2::Header::channels();
          p_Var24 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
          uVar46 = 0;
          for (; p_Var25 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end(), p_Var24 != p_Var25;
              p_Var24 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var24)) {
            iVar12 = (int)uVar46 + (int)(uVar46 / 3) * -3;
            if (iVar12 == 2) {
              Imf_3_2::Slice::Slice
                        ((Slice *)&frameBuffer,UINT,
                         (char *)(puVar6 + -(long)(iVar45 / *(int *)&p_Var24[9].field_0x4)),4,0,
                         *(int *)&p_Var24[9].field_0x4,*(int *)&p_Var24[9]._M_parent,0.0,false,false
                        );
              Imf_3_2::FrameBuffer::insert((char *)&i,(Slice *)(p_Var24 + 1));
            }
            else if (iVar12 == 1) {
              Imf_3_2::Slice::Slice
                        ((Slice *)&frameBuffer,FLOAT,
                         (char *)(pfVar5 + -(long)(iVar45 / *(int *)&p_Var24[9].field_0x4)),4,0,
                         *(int *)&p_Var24[9].field_0x4,*(int *)&p_Var24[9]._M_parent,0.0,false,false
                        );
              Imf_3_2::FrameBuffer::insert((char *)&i,(Slice *)(p_Var24 + 1));
            }
            else {
              Imf_3_2::Slice::Slice
                        ((Slice *)&frameBuffer,HALF,
                         (char *)(phVar51 + -(long)(iVar45 / *(int *)&p_Var24[9].field_0x4)),2,0,
                         *(int *)&p_Var24[9].field_0x4,*(int *)&p_Var24[9]._M_parent,0.0,false,false
                        );
              Imf_3_2::FrameBuffer::insert((char *)&i,(Slice *)(p_Var24 + 1));
            }
            uVar46 = (ulong)((int)uVar46 + 1);
          }
          Imf_3_2::InputPart::setFrameBuffer((FrameBuffer *)&pt);
          iVar12 = piVar20[1];
          bVar37 = piVar20[3] < iVar12;
          if (iVar12 <= piVar20[3]) {
            do {
              Imf_3_2::InputPart::readPixels((int)&pt);
              bVar37 = piVar20[3] <= iVar12;
              bVar8 = iVar12 < piVar20[3];
              iVar12 = iVar12 + 1;
            } while (bVar8);
          }
          if (uintChannels.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(uintChannels.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)uintChannels.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)uintChannels.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (floatChannels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(floatChannels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)floatChannels.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)floatChannels.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (halfChannels.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(halfChannels.
                            super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)halfChannels.
                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)halfChannels.
                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          std::
          _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                       *)&i);
          bVar8 = true;
        }
        if (bVar37) {
          bVar8 = false;
        }
        if (bVar8) {
          Imf_3_2::MultiPartInputFile::header(iVar17);
          puVar26 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
          sVar48 = puVar26[1];
          bVar50 = true;
          if (((sVar48 == DAT_0012aa88) && (bVar50 = bVar55, sVar48 != 0)) &&
             (iVar12 = bcmp((void *)*puVar26,DEEPTILE_abi_cxx11_,sVar48), iVar12 != 0)) {
            bVar50 = true;
          }
        }
      }
      if (bVar54 || !reduceMemory) {
        Imf_3_2::MultiPartInputFile::flushPartCache();
        Imf_3_2::TiledInputPart::TiledInputPart((TiledInputPart *)&pt,in,iVar9);
        Imf_3_2::TiledInputPart::header();
        piVar20 = (int *)Imf_3_2::Header::dataWindow();
        iVar12 = piVar20[2];
        iVar45 = *piVar20;
        iVar10 = Imf_3_2::TiledInputPart::numXLevels();
        iVar11 = Imf_3_2::TiledInputPart::numYLevels();
        Imf_3_2::TiledInputPart::header();
        piVar20 = (int *)Imf_3_2::Header::tileDescription();
        pHVar18 = (Header *)Imf_3_2::TiledInputPart::header();
        lVar23 = Imf_3_2::calculateBytesPerPixel(pHVar18);
        sVar47 = ((long)iVar12 - (long)iVar45) + 1;
        if (reduceMemory) {
          bVar55 = false;
          bVar37 = false;
          if (lVar23 * sVar47 < 0x7a1201) {
            bVar55 = false;
            bVar37 = false;
            if (lVar23 * (ulong)(uint)(piVar20[1] * *piVar20) < 0xf4241) goto LAB_001129bc;
          }
        }
        else {
LAB_001129bc:
          i._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               i._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
          i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &i._map._M_t._M_impl.super__Rb_tree_header._M_header;
          i._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::vector
                    (&halfChannels,sVar47,(allocator_type *)&frameBuffer);
          std::vector<float,_std::allocator<float>_>::vector
                    (&floatChannels,sVar47,(allocator_type *)&frameBuffer);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&uintChannels,sVar47,(allocator_type *)&frameBuffer);
          Imf_3_2::TiledInputPart::header();
          Imf_3_2::Header::channels();
          p_Var24 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
          uVar46 = 0;
          for (; p_Var25 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end(), p_Var24 != p_Var25;
              p_Var24 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var24)) {
            iVar12 = (int)uVar46 + (int)(uVar46 / 3) * -3;
            if (iVar12 == 2) {
LAB_00112af2:
              Imf_3_2::Slice::Slice
                        ((Slice *)&frameBuffer,UINT,
                         (char *)(uintChannels.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start +
                                 -(iVar45 / *(int *)&p_Var24[9].field_0x4)),4,0,
                         *(int *)&p_Var24[9].field_0x4,*(int *)&p_Var24[9]._M_parent,0.0,false,false
                        );
              Imf_3_2::FrameBuffer::insert((char *)&i,(Slice *)(p_Var24 + 1));
            }
            else {
              if (iVar12 == 1) {
                Imf_3_2::Slice::Slice
                          ((Slice *)&frameBuffer,FLOAT,
                           (char *)(floatChannels.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start +
                                   -(iVar45 / *(int *)&p_Var24[9].field_0x4)),4,0,
                           *(int *)&p_Var24[9].field_0x4,*(int *)&p_Var24[9]._M_parent,0.0,false,
                           false);
                Imf_3_2::FrameBuffer::insert((char *)&i,(Slice *)(p_Var24 + 1));
                goto LAB_00112af2;
              }
              Imf_3_2::Slice::Slice
                        ((Slice *)&frameBuffer,HALF,
                         (char *)(halfChannels.
                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                  ._M_impl.super__Vector_impl_data._M_start +
                                 -(iVar45 / *(int *)&p_Var24[9].field_0x4)),2,0,
                         *(int *)&p_Var24[9].field_0x4,*(int *)&p_Var24[9]._M_parent,0.0,false,false
                        );
              Imf_3_2::FrameBuffer::insert((char *)&i,(Slice *)(p_Var24 + 1));
            }
            uVar46 = (ulong)((int)uVar46 + 1);
          }
          Imf_3_2::TiledInputPart::setFrameBuffer((FrameBuffer *)&pt);
          iVar12 = 0;
          bVar55 = iVar11 < 1;
          if (0 < iVar11) {
            bVar55 = false;
            do {
              bVar37 = 0 < iVar10;
              if (0 < iVar10) {
                iVar45 = 0;
                do {
                  iVar16 = 0;
                  do {
                    iVar33 = iVar16;
                    iVar13 = Imf_3_2::TiledInputPart::numYTiles((int)&pt);
                    if (iVar13 <= iVar33) break;
                    for (iVar36 = 0; iVar14 = Imf_3_2::TiledInputPart::numXTiles((int)&pt),
                        iVar36 < iVar14; iVar36 = iVar36 + 1) {
                      Imf_3_2::TiledInputPart::readTile((int)&pt,iVar36,iVar33,iVar45);
                    }
                    iVar16 = iVar33 + 1;
                  } while (iVar14 <= iVar36);
                  if (iVar33 < iVar13) break;
                  iVar45 = iVar45 + 1;
                  bVar37 = iVar45 < iVar10;
                } while (iVar45 != iVar10);
              }
              if (bVar37) break;
              iVar12 = iVar12 + 1;
              bVar55 = iVar11 <= iVar12;
            } while (iVar12 != iVar11);
          }
          if (uintChannels.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(uintChannels.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)uintChannels.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)uintChannels.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (floatChannels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(floatChannels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)floatChannels.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)floatChannels.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (halfChannels.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(halfChannels.
                            super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)halfChannels.
                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)halfChannels.
                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          std::
          _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                       *)&i);
          bVar37 = true;
        }
        if (bVar55) {
          bVar37 = false;
        }
        if (bVar37) {
          Imf_3_2::MultiPartInputFile::header(iVar17);
          puVar26 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
          sVar48 = puVar26[1];
          if (sVar48 == DAT_0012aa48) {
            if (sVar48 == 0) {
              bVar50 = true;
            }
            else {
              iVar12 = bcmp((void *)*puVar26,TILEDIMAGE_abi_cxx11_,sVar48);
              if (iVar12 == 0) {
                bVar50 = true;
              }
            }
          }
        }
      }
      if ((reduceMemory & bVar53) == 0) {
        Imf_3_2::MultiPartInputFile::flushPartCache();
        Imf_3_2::DeepScanLineInputPart::DeepScanLineInputPart
                  ((DeepScanLineInputPart *)&floatChannels,in,iVar9);
        Imf_3_2::DeepScanLineInputPart::header();
        piVar20 = (int *)Imf_3_2::Header::dataWindow();
        iVar12 = piVar20[2];
        lVar23 = (long)*piVar20;
        pHVar18 = (Header *)Imf_3_2::DeepScanLineInputPart::header();
        lVar27 = Imf_3_2::calculateBytesPerPixel(pHVar18);
        uVar46 = (iVar12 - lVar23) + 1;
        uVar41 = uVar46 * 4;
        bVar53 = uVar41 < 0x7a1201;
        bVar55 = false;
        if (bVar53 || !reduceMemory) {
          Imf_3_2::Header::channels();
          p_Var24 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
          local_150 = 0;
          sVar48 = 0;
          uVar39 = 0;
          while( true ) {
            Imf_3_2::Header::channels();
            p_Var25 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
            if (p_Var24 == p_Var25) break;
            p_Var24 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var24);
            uVar39 = uVar39 - 1;
            sVar48 = sVar48 + 0x10;
            local_150 = local_150 + 1;
          }
          if (0x3fffffffffffffff < uVar46) {
            uVar41 = 0xffffffffffffffff;
          }
          pvVar28 = operator_new__(uVar41);
          plVar29 = (long *)operator_new__(sVar48 + 8);
          phVar51 = (pointer)-uVar39;
          *plVar29 = (long)phVar51;
          __s = (pointer)(plVar29 + 1);
          iVar45 = (int)uVar39;
          if (iVar45 != 0) {
            memset(__s,0,sVar48);
            uVar41 = uVar46 * 8;
            if (0x1fffffffffffffff < uVar46) {
              uVar41 = 0xffffffffffffffff;
            }
            lVar38 = 8;
            lVar52 = local_150;
            halfChannels.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
            _M_impl.super__Vector_impl_data._M_start = phVar51;
            halfChannels.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
            _M_impl.super__Vector_impl_data._M_finish = __s;
            do {
              phVar51 = halfChannels.
                        super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              pvVar30 = operator_new__(uVar41);
              pvVar32 = *(void **)((long)&phVar51->_h + lVar38);
              if (pvVar32 != (void *)0x0) {
                operator_delete__(pvVar32);
              }
              *(ulong *)((long)&phVar51[-4]._h + lVar38) = uVar46;
              *(void **)((long)&phVar51->_h + lVar38) = pvVar30;
              lVar38 = lVar38 + 0x10;
              lVar52 = lVar52 + -1;
              phVar51 = halfChannels.
                        super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              __s = halfChannels.
                    super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
                    super__Vector_impl_data._M_finish;
            } while (lVar52 != 0);
          }
          halfChannels.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl
          .super__Vector_impl_data._M_finish = __s;
          halfChannels.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl
          .super__Vector_impl_data._M_start = phVar51;
          frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
          frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          Imf_3_2::Slice::Slice(&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false)
          ;
          Imf_3_2::Slice::Slice
                    ((Slice *)&i,UINT,(char *)((long)pvVar28 + lVar23 * -4),4,0,1,1,0.0,false,false)
          ;
          Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
          Imf_3_2::Header::channels();
          p_Var24 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
          lVar52 = 8;
          while( true ) {
            Imf_3_2::Header::channels();
            p_Var25 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
            if (p_Var24 == p_Var25) break;
            Imf_3_2::DeepSlice::DeepSlice
                      ((DeepSlice *)&i,FLOAT,
                       (char *)(*(long *)((long)&(halfChannels.
                                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)->_h +
                                         lVar52) + lVar23 * -8),8,0,4,1,1,0.0,false,false);
            Imf_3_2::DeepFrameBuffer::insert((char *)&frameBuffer,(DeepSlice *)(p_Var24 + 1));
            p_Var24 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var24);
            lVar52 = lVar52 + 0x10;
          }
          Imf_3_2::DeepScanLineInputPart::setFrameBuffer((DeepFrameBuffer *)&floatChannels);
          i._map._M_t._M_impl._0_8_ = 0;
          i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          i._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          iVar10 = piVar20[1];
          bVar55 = piVar20[3] < iVar10;
          if (iVar10 <= piVar20[3]) {
            lVar52 = (~uVar39 & 0xffffffff) + 1;
            do {
              Imf_3_2::DeepScanLineInputPart::readPixelSampleCounts((int)&floatChannels);
              if (uVar46 == 0) {
                sVar47 = 0;
                lVar38 = 0;
              }
              else {
                uVar41 = 0;
                lVar38 = 0;
                sVar47 = 0;
                do {
                  if (iVar45 != 0) {
                    uVar35 = (ulong)*(uint *)((long)pvVar28 + uVar41 * 4);
                    uVar39 = uVar35;
                    if (1000 < lVar27 * uVar35) {
                      uVar39 = 0;
                    }
                    if (!reduceMemory) {
                      uVar39 = uVar35;
                    }
                    lVar38 = lVar38 + uVar35 * lVar52;
                    sVar47 = sVar47 + uVar39 * lVar52;
                  }
                  uVar41 = uVar41 + 1;
                } while (uVar46 != uVar41);
              }
              if ((!reduceMemory) || (lVar38 + sVar47 < 0x1000)) {
                std::vector<float,_std::allocator<float>_>::resize
                          ((vector<float,_std::allocator<float>_> *)&i,sVar47);
                if (uVar46 != 0) {
                  lVar49 = 0;
                  lVar38 = 0;
                  do {
                    if (iVar45 != 0) {
                      uVar41 = (ulong)*(uint *)((long)pvVar28 + lVar38 * 4);
                      lVar42 = 8;
                      lVar40 = local_150;
                      do {
                        if ((lVar27 * uVar41 < 0x3e9 || !reduceMemory) && uVar41 != 0) {
                          *(long *)(*(long *)((long)&(halfChannels.
                                                                                                            
                                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)->_h +
                                             lVar42) + lVar38 * 8) =
                               lVar49 * 4 + i._map._M_t._M_impl._0_8_;
                          lVar49 = lVar49 + uVar41;
                        }
                        else {
                          *(undefined8 *)
                           (*(long *)((long)&(halfChannels.
                                              super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                              ._M_impl.super__Vector_impl_data._M_finish)->_h +
                                     lVar42) + lVar38 * 8) = 0;
                        }
                        lVar42 = lVar42 + 0x10;
                        lVar40 = lVar40 + -1;
                      } while (lVar40 != 0);
                    }
                    bVar55 = lVar38 != iVar12 - lVar23;
                    lVar38 = lVar38 + 1;
                  } while (bVar55);
                }
                Imf_3_2::DeepScanLineInputPart::readPixels((int)&floatChannels);
              }
              bVar55 = piVar20[3] <= iVar10;
              bVar37 = iVar10 < piVar20[3];
              iVar10 = iVar10 + 1;
            } while (bVar37);
          }
          if (i._map._M_t._M_impl._0_8_ != 0) {
            operator_delete((void *)i._map._M_t._M_impl._0_8_,
                            (long)i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent -
                            i._map._M_t._M_impl._0_8_);
          }
          std::
          _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
                       *)&frameBuffer);
          Array<Imf_3_2::Array<void_*>_>::~Array((Array<Imf_3_2::Array<void_*>_> *)&halfChannels);
          operator_delete__(pvVar28);
        }
        if (!bVar55 && (bVar53 || !reduceMemory)) {
          Imf_3_2::MultiPartInputFile::header(iVar17);
          puVar26 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
          sVar48 = puVar26[1];
          if (sVar48 == DAT_0012aa68) {
            if (sVar48 == 0) {
              bVar50 = true;
            }
            else {
              iVar12 = bcmp((void *)*puVar26,DEEPSCANLINE_abi_cxx11_,sVar48);
              if (iVar12 == 0) {
                bVar50 = true;
              }
            }
          }
        }
      }
      if (bVar54 || !reduceMemory) {
        Imf_3_2::MultiPartInputFile::flushPartCache();
        Imf_3_2::DeepTiledInputPart::DeepTiledInputPart
                  ((DeepTiledInputPart *)&floatChannels,in,iVar9);
        Imf_3_2::DeepTiledInputPart::header();
        pHVar18 = (Header *)Imf_3_2::DeepTiledInputPart::header();
        iVar12 = Imf_3_2::calculateBytesPerPixel(pHVar18);
        Imf_3_2::DeepTiledInputPart::header();
        puVar19 = (uint *)Imf_3_2::Header::tileDescription();
        uVar2 = *puVar19;
        lVar27 = (long)(int)uVar2;
        uVar3 = puVar19[1];
        lVar23 = (long)(int)uVar3;
        iVar45 = Imf_3_2::DeepTiledInputPart::numYLevels();
        iVar10 = Imf_3_2::DeepTiledInputPart::numXLevels();
        uVar41 = lVar23 * lVar27;
        uVar46 = uVar41 * 4;
        if (0x3fffffffffffffff < uVar41) {
          uVar46 = 0xffffffffffffffff;
        }
        pcVar31 = (char *)operator_new__(uVar46);
        Imf_3_2::Header::channels();
        p_Var24 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
        lVar52 = 0;
        while( true ) {
          Imf_3_2::Header::channels();
          p_Var25 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
          if (p_Var24 == p_Var25) break;
          p_Var24 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var24);
          lVar52 = lVar52 + 1;
        }
        Array<Imf_3_2::Array2D<float_*>_>::Array
                  ((Array<Imf_3_2::Array2D<float_*>_> *)&halfChannels,lVar52);
        iVar11 = (int)lVar52;
        if (iVar11 != 0) {
          uVar46 = uVar41 * 8;
          if (0x1fffffffffffffff < uVar41) {
            uVar46 = 0xffffffffffffffff;
          }
          lVar49 = 0x10;
          lVar38 = lVar52;
          do {
            phVar51 = halfChannels.
                      super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            pvVar32 = operator_new__(uVar46);
            pvVar28 = *(void **)((long)&phVar51->_h + lVar49);
            if (pvVar28 != (void *)0x0) {
              operator_delete__(pvVar28);
            }
            *(long *)((long)&phVar51[-8]._h + lVar49) = lVar23;
            *(long *)((long)&phVar51[-4]._h + lVar49) = lVar27;
            *(void **)((long)&phVar51->_h + lVar49) = pvVar32;
            lVar49 = lVar49 + 0x18;
            lVar38 = lVar38 + -1;
          } while (lVar38 != 0);
        }
        frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
        frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        Imf_3_2::Slice::Slice(&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
        Imf_3_2::Slice::Slice((Slice *)&i,UINT,pcVar31,4,lVar27 * 4,1,1,0.0,true,true);
        Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
        Imf_3_2::Header::channels();
        p_Var24 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
        local_1b0 = 0x10;
        while( true ) {
          Imf_3_2::Header::channels();
          p_Var25 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
          if (p_Var24 == p_Var25) break;
          Imf_3_2::DeepSlice::DeepSlice
                    ((DeepSlice *)&i,FLOAT,
                     *(char **)((long)&(halfChannels.
                                        super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                        ._M_impl.super__Vector_impl_data._M_finish)->_h + local_1b0)
                     ,8,lVar27 * 8,4,1,1,0.0,true,true);
          Imf_3_2::DeepFrameBuffer::insert((char *)&frameBuffer,(DeepSlice *)(p_Var24 + 1));
          p_Var24 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var24);
          local_1b0 = local_1b0 + 0x18;
        }
        Imf_3_2::DeepTiledInputPart::setFrameBuffer((DeepFrameBuffer *)&floatChannels);
        i._map._M_t._M_impl._0_8_ = 0;
        i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        i._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        iVar16 = 0;
        bVar55 = 0 < iVar45;
        if (0 < iVar45) {
          bVar55 = true;
          do {
            bVar53 = 0 < iVar10;
            if (0 < iVar10) {
              iVar33 = 0;
              do {
                iVar13 = 0;
                do {
                  iVar36 = iVar13;
                  iVar14 = Imf_3_2::DeepTiledInputPart::numYTiles((int)&floatChannels);
                  if (iVar14 <= iVar36) break;
                  for (iVar1 = 0;
                      iVar15 = Imf_3_2::DeepTiledInputPart::numXTiles((int)&floatChannels),
                      iVar1 < iVar15; iVar1 = iVar1 + 1) {
                    Imf_3_2::DeepTiledInputPart::readPixelSampleCounts
                              ((int)&floatChannels,iVar1,iVar36,iVar1,iVar36,iVar33);
                    if ((int)uVar3 < 1) {
                      sVar47 = 0;
                      lVar38 = 0;
                    }
                    else {
                      lVar49 = 0;
                      lVar38 = 0;
                      sVar47 = 0;
                      pcVar34 = pcVar31;
                      do {
                        if (0 < (int)uVar2) {
                          uVar46 = 0;
                          do {
                            uVar39 = (ulong)(uint)(iVar11 * *(int *)(pcVar34 + uVar46 * 4));
                            lVar38 = lVar38 + uVar39;
                            uVar41 = 0;
                            if ((uint)(*(int *)(pcVar34 + uVar46 * 4) * iVar12) < 0x1000) {
                              uVar41 = uVar39;
                            }
                            if (!reduceMemory) {
                              uVar41 = uVar39;
                            }
                            sVar47 = sVar47 + uVar41;
                            uVar46 = uVar46 + 1;
                          } while (uVar2 != uVar46);
                        }
                        lVar49 = lVar49 + 1;
                        pcVar34 = pcVar34 + lVar27 * 4;
                      } while (lVar49 != lVar23);
                    }
                    if ((sVar47 != 0) &&
                       ((!reduceMemory || ((lVar38 + sVar47) * (long)iVar12 < 1000)))) {
                      std::vector<float,_std::allocator<float>_>::resize
                                ((vector<float,_std::allocator<float>_> *)&i,sVar47);
                      if (0 < (int)uVar3) {
                        lVar38 = 0;
                        lVar49 = 0;
                        do {
                          if (0 < (int)uVar2) {
                            lVar40 = 0;
                            do {
                              if ((reduceMemory) &&
                                 (999 < (uint)(*(int *)(pcVar31 + lVar40 * 4 + lVar38 * lVar27 * 4)
                                              * iVar12))) {
                                if (iVar11 != 0) {
                                  lVar44 = 0x10;
                                  lVar42 = lVar52;
                                  do {
                                    *(undefined8 *)
                                     (*(long *)((long)&halfChannels.
                                                                                                              
                                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish[-4]._h
                                               + lVar44) * lVar38 * 8 +
                                      *(long *)((long)&(halfChannels.
                                                                                                                
                                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)->_h +
                                               lVar44) + lVar40 * 8) = 0;
                                    lVar44 = lVar44 + 0x18;
                                    lVar42 = lVar42 + -1;
                                  } while (lVar42 != 0);
                                }
                              }
                              else if (iVar11 != 0) {
                                uVar4 = *(uint *)(pcVar31 + lVar40 * 4 + lVar38 * lVar27 * 4);
                                lVar42 = lVar49 * 4;
                                lVar49 = lVar49 + lVar52 * (ulong)uVar4;
                                lVar43 = 4;
                                lVar44 = lVar52;
                                do {
                                  *(long *)(*(long *)(halfChannels.
                                                                                                            
                                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish +
                                                  lVar43 * 2 + -4) * lVar38 * 8 +
                                            *(long *)(halfChannels.
                                                                                                            
                                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish +
                                                  lVar43 * 2) + lVar40 * 8) =
                                       i._map._M_t._M_impl._0_8_ + lVar42;
                                  lVar43 = lVar43 + 6;
                                  lVar42 = lVar42 + (ulong)uVar4 * 4;
                                  lVar44 = lVar44 + -1;
                                } while (lVar44 != 0);
                              }
                              lVar40 = lVar40 + 1;
                            } while (lVar40 != lVar27);
                          }
                          lVar38 = lVar38 + 1;
                        } while (lVar38 != lVar23);
                      }
                      Imf_3_2::DeepTiledInputPart::readTile((int)&floatChannels,iVar1,iVar36,iVar33)
                      ;
                    }
                  }
                  iVar13 = iVar36 + 1;
                } while (iVar15 <= iVar1);
                if (iVar36 < iVar14) break;
                iVar33 = iVar33 + 1;
                bVar53 = iVar33 < iVar10;
              } while (iVar33 != iVar10);
            }
            if (bVar53) break;
            iVar16 = iVar16 + 1;
            bVar55 = iVar16 < iVar45;
          } while (iVar16 != iVar45);
        }
        if (i._map._M_t._M_impl._0_8_ != 0) {
          operator_delete((void *)i._map._M_t._M_impl._0_8_,
                          (long)i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent -
                          i._map._M_t._M_impl._0_8_);
        }
        std::
        _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
        ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
                     *)&frameBuffer);
        Array<Imf_3_2::Array2D<float_*>_>::~Array
                  ((Array<Imf_3_2::Array2D<float_*>_> *)&halfChannels);
        operator_delete__(pcVar31);
        if (bVar55) {
          Imf_3_2::MultiPartInputFile::header(iVar17);
          puVar26 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
          sVar48 = puVar26[1];
          if (sVar48 == DAT_0012aa88) {
            if (sVar48 == 0) {
              bVar50 = true;
            }
            else {
              iVar17 = bcmp((void *)*puVar26,DEEPTILE_abi_cxx11_,sVar48);
              if (iVar17 == 0) {
                bVar50 = true;
              }
            }
          }
        }
      }
      iVar9 = iVar9 + 1;
      iVar17 = Imf_3_2::MultiPartInputFile::parts();
    } while (iVar9 < iVar17);
  }
  return bVar50;
}

Assistant:

bool
readMultiPart (MultiPartInputFile& in, bool reduceMemory, bool reduceTime)
{
    bool threw = false;
    for (int part = 0; part < in.parts (); ++part)
    {

        if (!enumsValid (in.header (part))) { threw = true; }

        bool     widePart      = false;
        bool     largeTiles    = false;
        Box2i    b             = in.header (part).dataWindow ();
        int      bytesPerPixel = calculateBytesPerPixel (in.header (part));
        uint64_t imageWidth    = static_cast<uint64_t> (b.max.x) -
                              static_cast<uint64_t> (b.min.x) + 1ll;
        uint64_t scanlinesInBuffer =
            numLinesInBuffer (in.header (part).compression ());

        //
        // very wide scanline parts take excessive memory to read.
        // compute memory required to store a group of scanlines
        // so tests can be skipped when reduceMemory is set
        //

        if (imageWidth * bytesPerPixel * scanlinesInBuffer >
            gMaxBytesPerScanline)
        {
            widePart = true;
        }
        //
        // significant memory is also required to read a tiled part
        // using the scanline interface with tall tiles - the scanlineAPI
        // needs to allocate memory to store an entire row of tiles
        //
        if (isTiled (in.header (part).type ()))
        {
            const TileDescription& tileDescription =
                in.header (part).tileDescription ();

            uint64_t tilesPerScanline =
                (imageWidth + tileDescription.xSize - 1ll) /
                tileDescription.xSize;
            uint64_t tileSize = static_cast<uint64_t> (tileDescription.xSize) *
                                static_cast<uint64_t> (tileDescription.ySize);

            if (tileSize * tilesPerScanline * bytesPerPixel >
                gMaxTileBytesPerScanline)
            {
                widePart = true;
            }
            if (tileSize * bytesPerPixel > gMaxTileBytes) { largeTiles = true; }
        }

        if (!reduceMemory || !widePart)
        {
            bool gotThrow = false;
            try
            {
                InputPart pt (in, part);
                gotThrow = readScanline (pt, reduceMemory, reduceTime);
            }
            catch (...)
            {
                gotThrow = true;
            }
            // only 'DeepTiled' parts are expected to throw
            // all others are an error
            if (gotThrow && in.header (part).type () != DEEPTILE)
            {
                threw = true;
            }
        }

        if (!reduceMemory || !largeTiles)
        {
            bool gotThrow = false;

            try
            {
                in.flushPartCache ();
                TiledInputPart pt (in, part);
                gotThrow = readTile (pt, reduceMemory, reduceTime);
            }
            catch (...)
            {
                gotThrow = true;
            }

            if (gotThrow && in.header (part).type () == TILEDIMAGE)
            {
                threw = true;
            }
        }

        if (!reduceMemory || !widePart)
        {
            bool gotThrow = false;

            try
            {
                in.flushPartCache ();
                DeepScanLineInputPart pt (in, part);
                gotThrow = readDeepScanLine (pt, reduceMemory, reduceTime);
            }
            catch (...)
            {
                gotThrow = true;
            }

            if (gotThrow && in.header (part).type () == DEEPSCANLINE)
            {
                threw = true;
            }
        }

        if (!reduceMemory || !largeTiles)
        {
            bool gotThrow = false;

            try
            {
                in.flushPartCache ();
                DeepTiledInputPart pt (in, part);
                gotThrow = readDeepTile (pt, reduceMemory, reduceTime);
            }
            catch (...)
            {
                gotThrow = true;
            }

            if (gotThrow && in.header (part).type () == DEEPTILE)
            {
                threw = true;
            }
        }
    }

    return threw;
}